

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidateDatatype
              (xmlRelaxNGValidCtxtPtr ctxt,xmlChar *value,xmlRelaxNGDefinePtr_conflict define,
              xmlNodePtr node)

{
  void *pvVar1;
  xmlRelaxNGDefinePtr pxVar2;
  xmlRelaxNGDefinePtr_conflict define_00;
  xmlRelaxNGValidStatePtr pxVar3;
  xmlChar *pxVar4;
  int iVar5;
  int iVar6;
  xmlChar *pxVar7;
  undefined8 uVar8;
  xmlRelaxNGDefinePtr *ppxVar9;
  void *result;
  
  if ((define != (xmlRelaxNGDefinePtr_conflict)0x0) &&
     (pvVar1 = define->data, pvVar1 != (void *)0x0)) {
    if (*(code **)((long)pvVar1 + 0x18) != (code *)0x0) {
      if ((define->attrs == (xmlRelaxNGDefinePtr)0x0) || (define->attrs->type != XML_RELAXNG_PARAM))
      {
        uVar8 = *(undefined8 *)((long)pvVar1 + 8);
        pxVar7 = define->name;
      }
      else {
        uVar8 = *(undefined8 *)((long)pvVar1 + 8);
        pxVar7 = define->name;
      }
      iVar5 = (**(code **)((long)pvVar1 + 0x18))(uVar8,pxVar7,value);
      if (-1 < iVar5) {
        iVar6 = 0;
        if (iVar5 != 1) {
          if (iVar5 == 2) {
            xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_DUPID,value,(xmlChar *)0x0,1);
            iVar6 = 2;
          }
          else {
            xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_TYPEVAL,define->name,value,1);
            iVar6 = -1;
          }
        }
        ppxVar9 = &define->attrs;
        while ((iVar6 == 0 && (pxVar2 = *ppxVar9, pxVar2 != (xmlRelaxNGDefinePtr)0x0))) {
          if (pxVar2->type != XML_RELAXNG_PARAM) goto LAB_00174fa6;
          if (*(code **)((long)pvVar1 + 0x28) == (code *)0x0) {
            iVar6 = 0;
          }
          else {
            iVar5 = (**(code **)((long)pvVar1 + 0x28))
                              (*(undefined8 *)((long)pvVar1 + 8),define->name,pxVar2->name,
                               pxVar2->value,value,0);
            iVar6 = -(uint)(iVar5 != 0);
          }
          ppxVar9 = &pxVar2->next;
        }
        if (iVar6 != 0) {
          return iVar6;
        }
LAB_00174fa6:
        define_00 = define->content;
        if (define_00 != (xmlRelaxNGDefinePtr_conflict)0x0) {
          pxVar3 = ctxt->state;
          pxVar7 = pxVar3->value;
          pxVar4 = pxVar3->endvalue;
          pxVar3->value = value;
          pxVar3->endvalue = (xmlChar *)0x0;
          iVar5 = xmlRelaxNGValidateValue(ctxt,define_00);
          pxVar3 = ctxt->state;
          pxVar3->value = pxVar7;
          pxVar3->endvalue = pxVar4;
          return iVar5;
        }
        return 0;
      }
    }
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_TYPE,define->name,(xmlChar *)0x0,0);
  }
  return -1;
}

Assistant:

static int
xmlRelaxNGValidateDatatype(xmlRelaxNGValidCtxtPtr ctxt,
                           const xmlChar * value,
                           xmlRelaxNGDefinePtr define, xmlNodePtr node)
{
    int ret, tmp;
    xmlRelaxNGTypeLibraryPtr lib;
    void *result = NULL;
    xmlRelaxNGDefinePtr cur;

    if ((define == NULL) || (define->data == NULL)) {
        return (-1);
    }
    lib = (xmlRelaxNGTypeLibraryPtr) define->data;
    if (lib->check != NULL) {
        if ((define->attrs != NULL) &&
            (define->attrs->type == XML_RELAXNG_PARAM)) {
            ret =
                lib->check(lib->data, define->name, value, &result, node);
        } else {
            ret = lib->check(lib->data, define->name, value, NULL, node);
        }
    } else
        ret = -1;
    if (ret < 0) {
        VALID_ERR2(XML_RELAXNG_ERR_TYPE, define->name);
        if ((result != NULL) && (lib != NULL) && (lib->freef != NULL))
            lib->freef(lib->data, result);
        return (-1);
    } else if (ret == 1) {
        ret = 0;
    } else if (ret == 2) {
        VALID_ERR2P(XML_RELAXNG_ERR_DUPID, value);
    } else {
        VALID_ERR3P(XML_RELAXNG_ERR_TYPEVAL, define->name, value);
        ret = -1;
    }
    cur = define->attrs;
    while ((ret == 0) && (cur != NULL) && (cur->type == XML_RELAXNG_PARAM)) {
        if (lib->facet != NULL) {
            tmp = lib->facet(lib->data, define->name, cur->name,
                             cur->value, value, result);
            if (tmp != 0)
                ret = -1;
        }
        cur = cur->next;
    }
    if ((ret == 0) && (define->content != NULL)) {
        const xmlChar *oldvalue, *oldendvalue;

        oldvalue = ctxt->state->value;
        oldendvalue = ctxt->state->endvalue;
        ctxt->state->value = (xmlChar *) value;
        ctxt->state->endvalue = NULL;
        ret = xmlRelaxNGValidateValue(ctxt, define->content);
        ctxt->state->value = (xmlChar *) oldvalue;
        ctxt->state->endvalue = (xmlChar *) oldendvalue;
    }
    if ((result != NULL) && (lib != NULL) && (lib->freef != NULL))
        lib->freef(lib->data, result);
    return (ret);
}